

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_text.cpp
# Opt level: O1

char * __thiscall
flatbuffers::JsonPrinter::GenFieldOffset
          (JsonPrinter *this,FieldDef *fd,Table *table,bool fixed,int indent,uint8_t *prev_val)

{
  Table TVar1;
  BaseType BVar2;
  long lVar3;
  char *pcVar4;
  ulong uVar5;
  ushort uVar6;
  undefined7 in_register_00000009;
  Table *val;
  Reference root;
  
  if ((int)CONCAT71(in_register_00000009,fixed) == 0) {
    if ((fd->flexbuffer == true) && (this->opts->json_nested_flexbuffers == true)) {
      uVar6 = (fd->value).offset;
      if (uVar6 < *(ushort *)(table + -(long)*(int *)table)) {
        uVar6 = *(ushort *)(table + ((ulong)uVar6 - (long)*(int *)table));
      }
      else {
        uVar6 = 0;
      }
      uVar5 = (ulong)uVar6;
      lVar3 = (ulong)*(uint *)(table + *(uint *)(table + uVar5) + uVar5) +
              *(uint *)(table + uVar5) + uVar5;
      TVar1 = table[lVar3 + 2];
      root.data_ = (uint8_t *)(table + lVar3 + 2 + -(ulong)(byte)table[lVar3 + 3]);
      root._8_8_ = (1L << ((byte)TVar1 & 3)) << 8 | (ulong)((byte)TVar1 >> 2) << 0x20 |
                   (ulong)(byte)table[lVar3 + 3];
      flexbuffers::Reference::ToString
                (&root,true,this->opts->strict_json,this->text,false,0,"",false);
      return (char *)0x0;
    }
    if ((fd->nested_flatbuffer != (StructDef *)0x0) && (this->opts->json_nested_flatbuffers == true)
       ) {
      uVar6 = (fd->value).offset;
      if (uVar6 < *(ushort *)(table + -(long)*(int *)table)) {
        uVar6 = *(ushort *)(table + ((ulong)uVar6 - (long)*(int *)table));
      }
      else {
        uVar6 = 0;
      }
      uVar5 = (ulong)uVar6;
      pcVar4 = GenStruct(this,fd->nested_flatbuffer,
                         table + (ulong)*(uint *)(table + (ulong)*(uint *)(table + uVar5) + 4 +
                                                          uVar5) + *(uint *)(table + uVar5) + uVar5
                                 + 4,indent);
      return pcVar4;
    }
    if (((fd->value).type.base_type == BASE_TYPE_STRUCT) &&
       (((fd->value).type.struct_def)->fixed == true)) {
      uVar6 = (fd->value).offset;
      if (uVar6 < *(ushort *)(table + -(long)*(int *)table)) {
        uVar6 = *(ushort *)(table + ((ulong)uVar6 - (long)*(int *)table));
      }
      else {
        uVar6 = 0;
      }
      val = table + uVar6;
      if (uVar6 == 0) {
        val = (Table *)0x0;
      }
    }
    else {
      uVar6 = (fd->value).offset;
      if (uVar6 < *(ushort *)(table + -(long)*(int *)table)) {
        uVar6 = *(ushort *)(table + ((ulong)uVar6 - (long)*(int *)table));
      }
      else {
        uVar6 = 0;
      }
      if (uVar6 == 0) {
        val = (Table *)0x0;
      }
      else {
        val = table + (ulong)*(uint *)(table + uVar6) + (ulong)uVar6;
      }
    }
  }
  else {
    BVar2 = (fd->value).type.base_type;
    if ((BVar2 != BASE_TYPE_ARRAY) &&
       ((BVar2 != BASE_TYPE_STRUCT || (((fd->value).type.struct_def)->fixed == false)))) {
      __assert_fail("IsStruct(fd.value.type) || IsArray(fd.value.type)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_text.cpp"
                    ,0x11a,
                    "const char *flatbuffers::JsonPrinter::GenFieldOffset(const FieldDef &, const Table *, bool, int, const uint8_t *)"
                   );
    }
    val = table + (fd->value).offset;
  }
  pcVar4 = PrintOffset(this,val,&(fd->value).type,indent,prev_val,-1);
  return pcVar4;
}

Assistant:

const char *GenFieldOffset(const FieldDef &fd, const Table *table, bool fixed,
                             int indent, const uint8_t *prev_val) {
    const void *val = nullptr;
    if (fixed) {
      // The only non-scalar fields in structs are structs or arrays.
      FLATBUFFERS_ASSERT(IsStruct(fd.value.type) || IsArray(fd.value.type));
      val = reinterpret_cast<const Struct *>(table)->GetStruct<const void *>(
          fd.value.offset);
    } else if (fd.flexbuffer && opts.json_nested_flexbuffers) {
      // We could verify this FlexBuffer before access, but since this sits
      // inside a FlatBuffer that we don't know wether it has been verified or
      // not, there is little point making this part safer than the parent..
      // The caller should really be verifying the whole.
      // If the whole buffer is corrupt, we likely crash before we even get
      // here.
      auto vec = table->GetPointer<const Vector<uint8_t> *>(fd.value.offset);
      auto root = flexbuffers::GetRoot(vec->data(), vec->size());
      root.ToString(true, opts.strict_json, text);
      return nullptr;
    } else if (fd.nested_flatbuffer && opts.json_nested_flatbuffers) {
      auto vec = table->GetPointer<const Vector<uint8_t> *>(fd.value.offset);
      auto root = GetRoot<Table>(vec->data());
      return GenStruct(*fd.nested_flatbuffer, root, indent);
    } else {
      val = IsStruct(fd.value.type)
                ? table->GetStruct<const void *>(fd.value.offset)
                : table->GetPointer<const void *>(fd.value.offset);
    }
    return PrintOffset(val, fd.value.type, indent, prev_val, -1);
  }